

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalSimple::Deserialize(LogicalSimple *this,Deserializer *deserializer)

{
  LogicalOperatorType type;
  int iVar1;
  _func_int **in_RAX;
  LogicalOperator *this_00;
  _func_int **pp_Var2;
  _func_int **local_28;
  
  local_28 = in_RAX;
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"info");
  if ((char)iVar1 == '\0') {
    pp_Var2 = (_func_int **)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pp_Var2 = (_func_int **)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParseInfo::Deserialize((ParseInfo *)&local_28,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pp_Var2 = local_28;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (LogicalOperator *)operator_new(0x70);
  type = Deserializer::Get<duckdb::LogicalOperatorType>(deserializer);
  LogicalOperator::LogicalOperator(this_00,type);
  this_00->_vptr_LogicalOperator = (_func_int **)&PTR__LogicalSimple_02470ac8;
  this_00[1]._vptr_LogicalOperator = pp_Var2;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalSimple::Deserialize(Deserializer &deserializer) {
	auto info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "info");
	auto result = duckdb::unique_ptr<LogicalSimple>(new LogicalSimple(deserializer.Get<LogicalOperatorType>(), std::move(info)));
	return std::move(result);
}